

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbo_linecount.cpp
# Opt level: O3

longlong turbo_linecount_file(char *filename,tlc_error_t *error,char **errorstring)

{
  _Alloc_hider _Var1;
  tlc_linecount_t tVar2;
  char *pcVar3;
  tlc_string_t errstr;
  tlc_string_t local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  tVar2 = TURBOLINECOUNT::CLineCount::LineCount(filename,error,&local_40);
  _Var1._M_p = local_40._M_dataplus._M_p;
  if (errorstring != (char **)0x0) {
    pcVar3 = strdup(local_40._M_dataplus._M_p);
    *errorstring = pcVar3;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var1._M_p != &local_40.field_2) {
    operator_delete(_Var1._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return tVar2;
}

Assistant:

long long turbo_linecount_file(const char *filename, tlc_error_t * error, char ** errorstring)
#endif
{
	TURBOLINECOUNT::tlc_string_t errstr;

	long long linecount = TURBOLINECOUNT::CLineCount::LineCount(filename, error, &errstr);

	if (errorstring)
	{
		*errorstring = _tcsdup(errstr.c_str());
	}

	return linecount;
}